

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::Reset
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,IPipelineState *pPSO)

{
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar1;
  PipelineStateVkImpl *pPVar2;
  RayTracingPipelineDesc *pRVar3;
  runtime_error *anon_var_0;
  RayTracingProperties *RayTracingProps;
  IPipelineState *pPSO_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  std::
  vector<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
  ::clear(&this->m_DbgHitGroupBindings);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_RayGenShaderRecord);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_MissShadersRecord);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_CallableShadersRecord);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_HitGroupsRecord);
  this->m_Changed = true;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,(PipelineStateVkImpl *)0x0);
  (this->
  super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ).m_Desc.pPSO = pPSO;
  this_00 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  pGVar1 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  ValidateShaderBindingTableDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
              ).m_Desc,(pGVar1->RayTracing).ShaderGroupHandleSize,
             (pGVar1->RayTracing).MaxShaderRecordStride);
  pPVar2 = ClassPtrCast<Diligent::PipelineStateVkImpl,Diligent::IPipelineState>
                     ((this->
                      super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      ).m_Desc.pPSO);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,pPVar2);
  pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
  pRVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
                     (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  this->m_ShaderRecordSize = (uint)pRVar3->ShaderRecordSize;
  this->m_ShaderRecordStride = this->m_ShaderRecordSize + (pGVar1->RayTracing).ShaderGroupHandleSize
  ;
  return;
}

Assistant:

Reset(IPipelineState* pPSO) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        this->m_DbgHitGroupBindings.clear();
#endif
        this->m_RayGenShaderRecord.clear();
        this->m_MissShadersRecord.clear();
        this->m_CallableShadersRecord.clear();
        this->m_HitGroupsRecord.clear();
        this->m_Changed = true;
        this->m_pPSO    = nullptr;

        this->m_Desc.pPSO = pPSO;

        const RayTracingProperties& RayTracingProps = this->GetDevice()->GetAdapterInfo().RayTracing;
        try
        {
            ValidateShaderBindingTableDesc(this->m_Desc, RayTracingProps.ShaderGroupHandleSize, RayTracingProps.MaxShaderRecordStride);
        }
        catch (const std::runtime_error&)
        {
            return;
        }

        this->m_pPSO               = ClassPtrCast<PipelineStateImplType>(this->m_Desc.pPSO);
        this->m_ShaderRecordSize   = this->m_pPSO->GetRayTracingPipelineDesc().ShaderRecordSize;
        this->m_ShaderRecordStride = this->m_ShaderRecordSize + RayTracingProps.ShaderGroupHandleSize;
    }